

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O1

void __thiscall QResource::QResource(QResource *this,QString *file,QLocale *locale)

{
  QResourcePrivate *this_00;
  
  this_00 = (QResourcePrivate *)operator_new(0x90);
  QLocale::QLocale((QLocale *)this_00);
  (this_00->children).d.d = (Data *)0x0;
  (this_00->children).d.ptr = (QString *)0x0;
  (this_00->children).d.size = 0;
  (this_00->fileName).d.d = (Data *)0x0;
  (this_00->fileName).d.ptr = (char16_t *)0x0;
  (this_00->fileName).d.size = 0;
  (this_00->absoluteFilePath).d.d = (Data *)0x0;
  (this_00->absoluteFilePath).d.ptr = (char16_t *)0x0;
  (this_00->absoluteFilePath).d.size = 0;
  (this_00->related).d.d = (Data *)0x0;
  (this_00->related).d.ptr = (QResourceRoot **)0x0;
  (this_00->related).d.size = 0;
  this_00->q_ptr = this;
  QResourcePrivate::clear(this_00);
  (this->d_ptr).d = this_00;
  QString::operator=(&this_00->fileName,file);
  QLocale::operator=((QLocale *)this_00,locale);
  return;
}

Assistant:

QResource::QResource(const QString &file, const QLocale &locale) : d_ptr(new QResourcePrivate(this))
{
    Q_D(QResource);
    d->fileName = file;
    d->locale = locale;
}